

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

void ge_p3_tobytes(uint8_t *s,ge_p3 *h)

{
  fe x;
  uint8_t s_1 [32];
  fe y;
  fe recip;
  fe_loose local_c8;
  uint8_t local_98 [32];
  fe local_78;
  fe local_50;
  
  local_c8.v[4] = (h->Z).v[4];
  local_c8.v[0] = (h->Z).v[0];
  local_c8.v[1] = (h->Z).v[1];
  local_c8.v[2] = (h->Z).v[2];
  local_c8.v[3] = (h->Z).v[3];
  fe_loose_invert(&local_50,&local_c8);
  fe_mul_impl(local_c8.v,(fe_limb_t *)h,local_50.v);
  fe_mul_impl(local_78.v,(h->Y).v,local_50.v);
  fe_tobytes(s,&local_78);
  fe_tobytes(local_98,(fe *)&local_c8);
  s[0x1f] = s[0x1f] ^ local_98[0] << 7;
  return;
}

Assistant:

static void ge_p3_tobytes(uint8_t s[32], const ge_p3 *h) {
  fe recip;
  fe x;
  fe y;

  fe_invert(&recip, &h->Z);
  fe_mul_ttt(&x, &h->X, &recip);
  fe_mul_ttt(&y, &h->Y, &recip);
  fe_tobytes(s, &y);
  s[31] ^= fe_isnegative(&x) << 7;
}